

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SySetPut(SySet *pSet,void *pItem)

{
  sxu32 sVar1;
  void *pvVar2;
  uint uVar3;
  uint uVar4;
  sxu32 sVar5;
  long lVar6;
  
  uVar3 = pSet->nUsed;
  uVar4 = pSet->nSize;
  if (uVar3 < uVar4) {
    pvVar2 = pSet->pBase;
  }
  else {
    if (pSet->pAllocator == (SyMemBackend *)0x0) {
      return -4;
    }
    if (uVar4 == 0) {
      pSet->nSize = 4;
      uVar4 = 4;
    }
    pvVar2 = SyMemBackendRealloc(pSet->pAllocator,pSet->pBase,uVar4 * pSet->eSize * 2);
    if (pvVar2 == (void *)0x0) {
      return -1;
    }
    pSet->pBase = pvVar2;
    pSet->nSize = pSet->nSize << 1;
    uVar3 = pSet->nUsed;
  }
  sVar1 = pSet->eSize;
  uVar3 = uVar3 * sVar1;
  for (lVar6 = 0;
      (((sVar5 = (sxu32)lVar6, sVar1 != sVar5 &&
        (*(undefined1 *)((long)pvVar2 + lVar6 + (ulong)uVar3) = *(undefined1 *)((long)pItem + lVar6)
        , sVar1 - 1 != sVar5)) &&
       (*(undefined1 *)((long)pvVar2 + lVar6 + (ulong)uVar3 + 1) =
             *(undefined1 *)((long)pItem + lVar6 + 1), sVar1 - 2 != sVar5)) &&
      (*(undefined1 *)((long)pvVar2 + lVar6 + (ulong)uVar3 + 2) =
            *(undefined1 *)((long)pItem + lVar6 + 2), sVar1 - 3 != sVar5)); lVar6 = lVar6 + 4) {
    *(undefined1 *)((long)pvVar2 + lVar6 + (ulong)uVar3 + 3) =
         *(undefined1 *)((long)pItem + lVar6 + 3);
  }
  pSet->nUsed = pSet->nUsed + 1;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SySetPut(SySet *pSet, const void *pItem)
{
	unsigned char *zbase;
	if( pSet->nUsed >= pSet->nSize ){
		void *pNew;
		if( pSet->pAllocator == 0 ){
			return  SXERR_LOCKED;
		}
		if( pSet->nSize <= 0 ){
			pSet->nSize = 4;
		}
		pNew = SyMemBackendRealloc(pSet->pAllocator, pSet->pBase, pSet->eSize * pSet->nSize * 2);
		if( pNew == 0 ){
			return SXERR_MEM;
		}
		pSet->pBase = pNew;
		pSet->nSize <<= 1;
	}
	zbase = (unsigned char *)pSet->pBase;
	SX_MACRO_FAST_MEMCPY(pItem, &zbase[pSet->nUsed * pSet->eSize], pSet->eSize);
	pSet->nUsed++;	
	return SXRET_OK;
}